

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v4_8.c
# Opt level: O0

int can_fixup_bittiming_v4_8(net_device *dev,can_bittiming *bt,can_bittiming_const *btc)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  long in_RDX;
  uint *in_RSI;
  net_device *in_RDI;
  uint32_t __rem_1;
  uint32_t __base_1;
  uint32_t __rem;
  uint32_t __base;
  u64 brp64;
  int alltseg;
  int tseg1;
  can_priv *priv;
  ulong local_38;
  int local_4;
  
  puVar3 = (uint *)netdev_priv(in_RDI);
  uVar1 = in_RSI[3] + in_RSI[4];
  if (in_RSI[6] == 0) {
    in_RSI[6] = 1;
  }
  if ((((*(uint *)(in_RDX + 0x20) < in_RSI[6]) || (uVar1 < *(uint *)(in_RDX + 0x10))) ||
      (*(uint *)(in_RDX + 0x14) < uVar1)) ||
     ((in_RSI[5] < *(uint *)(in_RDX + 0x18) || (*(uint *)(in_RDX + 0x1c) < in_RSI[5])))) {
    local_4 = -0x22;
  }
  else {
    local_38 = (ulong)*puVar3 * (ulong)in_RSI[2];
    if (1 < *(uint *)(in_RDX + 0x2c)) {
      local_38 = local_38 / *(uint *)(in_RDX + 0x2c);
    }
    local_38._0_4_ = (uint)((local_38 + 499999999) / 1000000000);
    if (1 < *(uint *)(in_RDX + 0x2c)) {
      local_38._0_4_ = *(int *)(in_RDX + 0x2c) * (uint)local_38;
    }
    in_RSI[7] = (uint)local_38;
    if ((in_RSI[7] < *(uint *)(in_RDX + 0x24)) || (*(uint *)(in_RDX + 0x28) < in_RSI[7])) {
      local_4 = -0x16;
    }
    else {
      iVar2 = in_RSI[3] + in_RSI[4] + in_RSI[5] + 1;
      *in_RSI = *puVar3 / (in_RSI[7] * iVar2);
      in_RSI[1] = (int)((uVar1 + 1) * 1000) / iVar2;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int can_fixup_bittiming(struct net_device *dev, struct can_bittiming *bt,
			       const struct can_bittiming_const *btc)
{
	struct can_priv *priv = netdev_priv(dev);
	int tseg1, alltseg;
	u64 brp64;

	tseg1 = bt->prop_seg + bt->phase_seg1;
	if (!bt->sjw)
		bt->sjw = 1;
	if (bt->sjw > btc->sjw_max ||
	    tseg1 < btc->tseg1_min || tseg1 > btc->tseg1_max ||
	    bt->phase_seg2 < btc->tseg2_min || bt->phase_seg2 > btc->tseg2_max)
		return -ERANGE;

	brp64 = (u64)priv->clock.freq * (u64)bt->tq;
	if (btc->brp_inc > 1)
		do_div(brp64, btc->brp_inc);
	brp64 += 500000000UL - 1;
	do_div(brp64, 1000000000UL); /* the practicable BRP */
	if (btc->brp_inc > 1)
		brp64 *= btc->brp_inc;
	bt->brp = (u32)brp64;

	if (bt->brp < btc->brp_min || bt->brp > btc->brp_max)
		return -EINVAL;

	alltseg = bt->prop_seg + bt->phase_seg1 + bt->phase_seg2 + 1;
	bt->bitrate = priv->clock.freq / (bt->brp * alltseg);
	bt->sample_point = ((tseg1 + 1) * 1000) / alltseg;

	return 0;
}